

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processLine(Binasc *this,ostream *out,string *input,int lineCount)

{
  byte bVar1;
  size_type sVar2;
  int index;
  int iVar3;
  long lVar4;
  char cVar5;
  string *psVar6;
  allocator local_79;
  int local_78;
  int local_74;
  string local_70;
  string word;
  
  sVar2 = input->_M_string_length;
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  index = 0;
  local_74 = 1;
  local_78 = lineCount;
  do {
    while( true ) {
      while( true ) {
        if ((int)sVar2 <= index) goto LAB_0012238a;
        bVar1 = (input->_M_dataplus)._M_p[index];
        if ((1 < bVar1 - 9) && (bVar1 != 0x20)) break;
        index = index + 1;
      }
      if (bVar1 != 0x22) break;
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70,"\"",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator<<(out,(string *)&word);
    }
    if (bVar1 == 0x2b) {
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70," \n\t",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      psVar6 = &local_70;
      std::__cxx11::string::~string((string *)&local_70);
      iVar3 = processAsciiWord((Binasc *)psVar6,out,&word,local_78);
    }
    else if (bVar1 == 0x70) {
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70," \n\t",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      psVar6 = &local_70;
      std::__cxx11::string::~string((string *)&local_70);
      iVar3 = processMidiPitchBendWord((Binasc *)psVar6,out,&word,local_78);
    }
    else if (bVar1 == 0x74) {
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70," \n\t",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      psVar6 = &local_70;
      std::__cxx11::string::~string((string *)&local_70);
      iVar3 = processMidiTempoWord((Binasc *)psVar6,out,&word,local_78);
    }
    else if (bVar1 == 0x76) {
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70," \n\t",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      psVar6 = &local_70;
      std::__cxx11::string::~string((string *)&local_70);
      iVar3 = processVlvWord((Binasc *)psVar6,out,&word,local_78);
    }
    else {
      if (((bVar1 == 0x23) || (bVar1 == 0x2f)) || (bVar1 == 0x3b)) goto LAB_0012238a;
      psVar6 = &local_70;
      std::__cxx11::string::string((string *)&local_70," \n\t",&local_79);
      index = getWord((Binasc *)psVar6,&word,input,&local_70,index);
      std::__cxx11::string::~string((string *)&local_70);
      cVar5 = (char)&word;
      psVar6 = &word;
      lVar4 = std::__cxx11::string::find(cVar5,0x27);
      if (lVar4 == -1) {
        psVar6 = &word;
        lVar4 = std::__cxx11::string::find(cVar5,0x2c);
        if ((lVar4 == -1) && (word._M_string_length < 3)) {
          iVar3 = processHexWord((Binasc *)psVar6,out,&word,local_78);
        }
        else {
          iVar3 = processBinaryWord((Binasc *)psVar6,out,&word,local_78);
        }
      }
      else {
        iVar3 = processDecimalWord((Binasc *)psVar6,out,&word,local_78);
      }
    }
  } while (iVar3 != 0);
  local_74 = 0;
LAB_0012238a:
  std::__cxx11::string::~string((string *)&word);
  return local_74;
}

Assistant:

int Binasc::processLine(std::ostream& out, const std::string& input,
		int lineCount) {
	int status = 1;
	int i = 0;
	int length = (int)input.size();
	std::string word;
	while (i<length) {
		if ((input[i] == ';') || (input[i] == '#') || (input[i] == '/')) {
			// comment to end of line, so ignore
			return status;
		} else if ((input[i] == ' ') || (input[i] == '\n')
				|| (input[i] == '\t')) {
			// ignore whitespace
			i++;
			continue;
		} else if (input[i] == '+') {
			i = getWord(word, input, " \n\t", i);
			status = processAsciiWord(out, word, lineCount);
		} else if (input[i] == '"') {
			i = getWord(word, input, "\"", i);
			status = processStringWord(out, word, lineCount);
		} else if (input[i] == 'v') {
			i = getWord(word, input, " \n\t", i);
			status = processVlvWord(out, word, lineCount);
		} else if (input[i] == 'p') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiPitchBendWord(out, word, lineCount);
		} else if (input[i] == 't') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiTempoWord(out, word, lineCount);
		} else {
			i = getWord(word, input, " \n\t", i);
			if (word.find('\'') != std::string::npos) {
				status = processDecimalWord(out, word, lineCount);
			} else if ((word.find(',') != std::string::npos)
					|| (word.size() > 2)) {
				status = processBinaryWord(out, word, lineCount);
			} else {
				status = processHexWord(out, word, lineCount);
			}
		}

		if (status == 0) {
			return 0;
		}

	}

	return 1;
}